

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_file.cpp
# Opt level: O2

bool __thiscall FileIO::Seek(FileIO *this,int32 pos,SeekMethod method)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((method < (end|current)) && ((this->flags & 1) != 0)) {
    iVar1 = fseek((FILE *)this->pfile,(long)pos,method);
    bVar2 = iVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool FileIO::Seek(int32 pos, SeekMethod method)
{
	if (!(GetFlags() & open))
		return false;

	int origin;
	switch (method)
	{
	case begin:
		origin = SEEK_SET;
		break;
	case current:
		origin = SEEK_CUR;
		break;
	case end:
		origin = SEEK_END;
		break;
	default:
		return false;
	}

	return (fseek(pfile, pos, origin) != 0);
}